

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deUniquePtr.hpp
# Opt level: O1

void __thiscall
de::details::UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_>::reset
          (UniqueBase<vkt::image::Image,_de::DefaultDeleter<vkt::image::Image>_> *this)

{
  Image *pIVar1;
  VkImage obj;
  Allocation *pAVar2;
  
  pIVar1 = (this->m_data).ptr;
  if (pIVar1 != (Image *)0x0) {
    obj.m_internal =
         (pIVar1->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
    if (obj.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                (&(pIVar1->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,obj
                );
    }
    (pIVar1->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
         (VkDevice)0x0;
    (pIVar1->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    (pIVar1->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
    (pIVar1->m_image).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    pAVar2 = (pIVar1->m_allocation).
             super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
    if (pAVar2 != (Allocation *)0x0) {
      (**(code **)((long)pAVar2->_vptr_Allocation + 8))();
      (pIVar1->m_allocation).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr = (Allocation *)0x0;
    }
    operator_delete(pIVar1,0x30);
    (this->m_data).ptr = (Image *)0x0;
  }
  return;
}

Assistant:

void UniqueBase<T, D>::reset (void)
{
	if (m_data.ptr != DE_NULL)
	{
		m_data.deleter(m_data.ptr);
		m_data.ptr = DE_NULL;
	}
}